

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void disas_crypto_two_reg_sha512(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *s_00;
  _Bool _Var1;
  uint uVar2;
  TCGv_ptr pTVar3;
  TCGv_ptr pTVar4;
  uintptr_t o;
  code *pcVar5;
  uintptr_t o_1;
  
  s_00 = s->uc->tcg_ctx;
  uVar2 = insn >> 10 & 3;
  if (uVar2 == 0) {
    if ((s->isar->id_aa64isar0 & 0xe000) == 0) goto LAB_0063b136;
    pcVar5 = gen_helper_crypto_sha512su0;
  }
  else {
    if ((uVar2 != 1) || ((s->isar->id_aa64isar0 & 0xf0000000000) == 0)) {
LAB_0063b136:
      unallocated_encoding_aarch64(s);
      return;
    }
    pcVar5 = gen_helper_crypto_sm4e;
  }
  _Var1 = fp_access_check(s);
  if (_Var1) {
    pTVar3 = vec_full_reg_ptr(s,insn & 0x1f);
    pTVar4 = vec_full_reg_ptr(s,insn >> 5 & 0x1f);
    (*pcVar5)(s_00,pTVar3,pTVar4);
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar3 + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar4 + (long)s_00));
    return;
  }
  return;
}

Assistant:

static void disas_crypto_two_reg_sha512(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int opcode = extract32(insn, 10, 2);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    TCGv_ptr tcg_rd_ptr, tcg_rn_ptr;
    bool feature;
    CryptoTwoOpFn *genfn;

    switch (opcode) {
    case 0: /* SHA512SU0 */
        feature = dc_isar_feature(aa64_sha512, s);
        genfn = gen_helper_crypto_sha512su0;
        break;
    case 1: /* SM4E */
        feature = dc_isar_feature(aa64_sm4, s);
        genfn = gen_helper_crypto_sm4e;
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    if (!feature) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    tcg_rd_ptr = vec_full_reg_ptr(s, rd);
    tcg_rn_ptr = vec_full_reg_ptr(s, rn);

    genfn(tcg_ctx, tcg_rd_ptr, tcg_rn_ptr);

    tcg_temp_free_ptr(tcg_ctx, tcg_rd_ptr);
    tcg_temp_free_ptr(tcg_ctx, tcg_rn_ptr);
}